

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_buffer_at_complexity(REF_DBL *metric,REF_GRID ref_grid,REF_DBL target_complexity)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  REF_NODE local_68;
  double local_58;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL current_complexity;
  int local_38;
  REF_INT relaxations;
  REF_INT node;
  REF_INT i;
  REF_NODE ref_node;
  REF_DBL target_complexity_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  _node = ref_grid->node;
  current_complexity._4_4_ = 0;
  ref_node = (REF_NODE)target_complexity;
  target_complexity_local = (REF_DBL)ref_grid;
  ref_grid_local = (REF_GRID)metric;
  while( true ) {
    if (9 < current_complexity._4_4_) {
      return 0;
    }
    uVar1 = ref_metric_buffer((REF_DBL *)ref_grid_local,(REF_GRID)target_complexity_local);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x8b1,"ref_metric_buffer_at_complexity",(ulong)uVar1,"buffer");
      return uVar1;
    }
    uVar1 = ref_metric_complexity
                      ((REF_DBL *)ref_grid_local,(REF_GRID)target_complexity_local,
                       (REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x8b2,"ref_metric_buffer_at_complexity",(ulong)uVar1,"cmp");
      return uVar1;
    }
    if (_ref_private_macro_code_rss_1 * 1e+20 <= 0.0) {
      local_58 = -(_ref_private_macro_code_rss_1 * 1e+20);
    }
    else {
      local_58 = _ref_private_macro_code_rss_1 * 1e+20;
    }
    if ((double)ref_node <= 0.0) {
      local_68 = (REF_NODE)((ulong)ref_node ^ 0x8000000000000000);
    }
    else {
      local_68 = ref_node;
    }
    if (local_58 <= (double)local_68) break;
    for (local_38 = 0; local_38 < _node->max; local_38 = local_38 + 1) {
      if (((-1 < local_38) && (local_38 < _node->max)) && (-1 < _node->global[local_38])) {
        for (relaxations = 0; relaxations < 6; relaxations = relaxations + 1) {
          dVar3 = pow((double)ref_node / _ref_private_macro_code_rss_1,0.6666666666666666);
          lVar2 = (long)(relaxations + local_38 * 6);
          ref_grid_local->cell[lVar2 + -2] =
               (REF_CELL)(dVar3 * (double)ref_grid_local->cell[lVar2 + -2]);
        }
      }
    }
    current_complexity._4_4_ = current_complexity._4_4_ + 1;
  }
  return 4;
}

Assistant:

REF_FCN REF_STATUS ref_metric_buffer_at_complexity(REF_DBL *metric,
                                                   REF_GRID ref_grid,
                                                   REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node, relaxations;
  REF_DBL current_complexity;

  /* global scaling and buffer */
  for (relaxations = 0; relaxations < 10; relaxations++) {
    RSS(ref_metric_buffer(metric, ref_grid), "buffer");
    RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(target_complexity, current_complexity)) {
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(target_complexity / current_complexity, 2.0 / 3.0);
    }
  }

  return REF_SUCCESS;
}